

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::drawBackground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if ((bVar2) && (*(int *)(*(long *)(lVar1 + 0x4e0) + 4) == 0)) {
    (**(code **)(**(long **)(lVar1 + 0x498) + 0xe8))(*(long **)(lVar1 + 0x498),painter,rect);
    return;
  }
  bVar2 = QPainter::testRenderHint(painter,Antialiasing);
  if (bVar2) {
    QPainter::setRenderHints(painter,1,0);
    QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
    QPainter::setRenderHints(painter,1,1);
    return;
  }
  QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
  return;
}

Assistant:

void QGraphicsView::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->backgroundBrush.style() == Qt::NoBrush) {
        d->scene->drawBackground(painter, rect);
        return;
    }

    const bool wasAa = painter->testRenderHint(QPainter::Antialiasing);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, false);
    painter->fillRect(rect, d->backgroundBrush);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, true);
}